

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O0

void __thiscall
JsrtRuntime::SetBeforeSweepCallback
          (JsrtRuntime *this,JsBeforeSweepCallback afterCollectCallback,void *callbackContext)

{
  CollectCallBack *pCVar1;
  void *callbackContext_local;
  JsBeforeSweepCallback afterCollectCallback_local;
  JsrtRuntime *this_local;
  
  if (afterCollectCallback == (JsBeforeSweepCallback)0x0) {
    if ((this->collectCallback != (CollectCallBack *)0x0) &&
       (this->beforeCollectCallback == (JsBeforeCollectCallback)0x0)) {
      ThreadContext::RemoveRecyclerCollectCallBack(this->threadContext,this->collectCallback);
      this->collectCallback = (CollectCallBack *)0x0;
    }
    this->beforeSweepCallback = (JsBeforeSweepCallback)0x0;
    this->beforeSweepCallbackContext = (void *)0x0;
  }
  else {
    if (this->collectCallback == (CollectCallBack *)0x0) {
      pCVar1 = ThreadContext::AddRecyclerCollectCallBack
                         (this->threadContext,RecyclerCollectCallbackStatic,this);
      this->collectCallback = pCVar1;
    }
    this->beforeSweepCallback = afterCollectCallback;
    this->beforeSweepCallbackContext = callbackContext;
  }
  return;
}

Assistant:

void JsrtRuntime::SetBeforeSweepCallback(JsBeforeSweepCallback afterCollectCallback, void * callbackContext)
{
    if (afterCollectCallback != nullptr)
    {
        if (this->collectCallback == nullptr)
        {
            this->collectCallback = this->threadContext->AddRecyclerCollectCallBack(RecyclerCollectCallbackStatic, this);
        }

        this->beforeSweepCallback = afterCollectCallback;
        this->beforeSweepCallbackContext = callbackContext;
    }
    else
    {
        if (this->collectCallback != nullptr && this->beforeCollectCallback == nullptr)
        {
            this->threadContext->RemoveRecyclerCollectCallBack(this->collectCallback);
            this->collectCallback = nullptr;
        }

        this->beforeSweepCallback = nullptr;
        this->beforeSweepCallbackContext = nullptr;
    }
}